

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

uint64_t mcpl_read_buffer(mcpl_fileinternal_t *f,uint *n,char **buf,char *errmsg)

{
  int iVar1;
  char *pcVar2;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined8 *in_RDI;
  size_t nb;
  size_t local_28;
  
  if (in_RDI[1] == 0) {
    local_28 = fread(in_RSI,1,4,(FILE *)*in_RDI);
  }
  else {
    iVar1 = gzread(in_RDI[1],in_RSI,4);
    local_28 = (size_t)iVar1;
  }
  if (local_28 != 4) {
    mcpl_error((char *)0x103885);
  }
  pcVar2 = mcpl_internal_calloc(nb,(size_t)in_RDI);
  *in_RDX = pcVar2;
  if (in_RDI[1] == 0) {
    local_28 = fread((void *)*in_RDX,1,(ulong)*in_RSI,(FILE *)*in_RDI);
  }
  else {
    iVar1 = gzread(in_RDI[1],*in_RDX,*in_RSI);
    local_28 = (size_t)iVar1;
  }
  if (local_28 != *in_RSI) {
    mcpl_error((char *)0x103915);
  }
  return (ulong)*in_RSI + 4;
}

Assistant:

MCPL_LOCAL uint64_t mcpl_read_buffer(mcpl_fileinternal_t* f, unsigned* n, char ** buf, const char * errmsg)
{
  //Reads buffer and returns number of bytes consumed from file
  size_t nb;
  if (f->filegz)
    nb = gzread(f->filegz, n, sizeof(*n));
  else
    nb = fread(n, 1, sizeof(*n), f->file);
  if (nb!=sizeof(*n))
    mcpl_error(errmsg);
  *buf = mcpl_internal_calloc(*n,1);
  if (f->filegz)
    nb = gzread(f->filegz, *buf, *n);
  else
    nb = fread(*buf, 1, *n, f->file);
  if (nb!=*n)
    mcpl_error(errmsg);
  return sizeof(*n) + *n;
}